

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall TPZManVector<TPZGraphEl_**,_10>::Shrink(TPZManVector<TPZGraphEl_**,_10> *this)

{
  TPZGraphEl ***pppTVar1;
  ulong uVar2;
  TPZGraphEl ***pppTVar3;
  int64_t i;
  ulong uVar4;
  
  uVar4 = (this->super_TPZVec<TPZGraphEl_**>).fNElements;
  if ((long)uVar4 < 0xb) {
    pppTVar3 = (this->super_TPZVec<TPZGraphEl_**>).fStore;
    pppTVar1 = this->fExtAlloc;
    if (pppTVar3 != pppTVar1) {
      uVar2 = 0;
      if ((long)uVar4 < 1) {
        uVar4 = uVar2;
      }
      for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        pppTVar1[uVar2] = pppTVar3[uVar2];
      }
      if (pppTVar3 != (TPZGraphEl ***)0x0) {
        operator_delete__(pppTVar3);
      }
      (this->super_TPZVec<TPZGraphEl_**>).fStore = pppTVar1;
      (this->super_TPZVec<TPZGraphEl_**>).fNAlloc = 10;
    }
  }
  else if ((this->super_TPZVec<TPZGraphEl_**>).fNAlloc != uVar4) {
    pppTVar3 = (TPZGraphEl ***)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    pppTVar1 = (this->super_TPZVec<TPZGraphEl_**>).fStore;
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      pppTVar3[uVar2] = pppTVar1[uVar2];
    }
    if (pppTVar1 != (TPZGraphEl ***)0x0) {
      operator_delete__(pppTVar1);
      uVar4 = (this->super_TPZVec<TPZGraphEl_**>).fNElements;
    }
    (this->super_TPZVec<TPZGraphEl_**>).fStore = pppTVar3;
    (this->super_TPZVec<TPZGraphEl_**>).fNAlloc = uVar4;
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Shrink() {
    // Philippe : Porque NumExtAlloc <= this->fNAlloc????
    //    if(this->fNElements <= NumExtAlloc && NumExtAlloc <= this->fNAlloc) {
    if (this->fNElements <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0; i < this->fNElements; i++)
                fExtAlloc[i] = this->fStore[i];

            if (this->fStore)
                delete [] this->fStore;

            this->fStore = fExtAlloc;
            this->fNAlloc = NumExtAlloc;
        }
    } else if (this->fNAlloc != this->fNElements) { // then  fExtAlloc != this->fStore  because  NumExtAlloc != this->fNAlloc
        // Philippe : Memoria alocada externamente nao pode ser deletada
        //          if(fExtAlloc) delete[] fExtAlloc;
        T *newstore = 0;

        if (this->fNElements)
            newstore = new T[this->fNElements];

        for (int64_t i = 0; i < this->fNElements; i++)
            newstore[i] = this->fStore[i];

        if (this->fStore)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNAlloc = this->fNElements;

        // Philippe Isto eh um absurdo
        //          fExtAlloc = this->fStore;
        //          NumExtAlloc = this->fNAlloc;
    }
}